

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_compliance_ut.c
# Opt level: O0

int pal_temperature_get_success(void)

{
  pal_result pVar1;
  unsigned_short local_e;
  pal_result result;
  unsigned_short temperature;
  
  printf("Execute test pal_temperature_get_success\r\n");
  local_e = 0xffff;
  pVar1 = pal_temperature_get(&local_e);
  if (pVar1 == PAL_OK) {
    if (local_e == 0xffff) {
      printf(
            "pal_temperature_get temperature failed. Expected:different then 0xFF Actual:0xFF\r\n\r\n"
            );
      result = PAL_ERROR_OUT_OF_MEMORY;
    }
    else {
      printf("Succeeded\r\n\r\n");
      result = PAL_OK;
    }
  }
  else {
    printf("pal_temperature_get return failed. Expected:PAL_OK Actual:%u\r\n\r\n",(ulong)pVar1);
    result = PAL_ERROR_OUT_OF_MEMORY;
  }
  return result;
}

Assistant:

int pal_temperature_get_success(void) {
    printf("Execute test pal_temperature_get_success\r\n");
    ///arrange
    unsigned short temperature = 0xFFFF;

    ///act
    pal_result result = pal_temperature_get(&temperature);

    ///assert
    if (result != PAL_OK) {
        printf("pal_temperature_get return failed. Expected:PAL_OK Actual:%u\r\n\r\n", result);
        return 1;
    }
    if (temperature == 0xFFFF) {
        printf("pal_temperature_get temperature failed. Expected:different then 0xFF Actual:0xFF\r\n\r\n");
        return 1;
    }
    printf("Succeeded\r\n\r\n");
    return 0;
}